

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O1

Vec_Str_t * Super_WriteLibraryTreeStr(Super_Man_t *pMan)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Vec_Str_t *vStr;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  size_t sVar9;
  int Counter;
  char pInsert [16];
  uint local_4c;
  char local_48 [24];
  
  vStr = (Vec_Str_t *)malloc(0x10);
  vStr->nCap = 1000;
  vStr->nSize = 0;
  pcVar5 = (char *)malloc(1000);
  vStr->pArray = pcVar5;
  Super_WriteFileHeaderStr(pMan,vStr);
  uVar2 = vStr->nSize;
  iVar8 = 9;
  do {
    uVar3 = vStr->nCap;
    if (vStr->nSize == uVar3) {
      if ((int)uVar3 < 0x10) {
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(0x10);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,0x10);
        }
        sVar9 = 0x10;
      }
      else {
        sVar9 = (ulong)uVar3 * 2;
        if ((int)sVar9 <= (int)uVar3) goto LAB_00378768;
        if (vStr->pArray == (char *)0x0) {
          pcVar5 = (char *)malloc(sVar9);
        }
        else {
          pcVar5 = (char *)realloc(vStr->pArray,sVar9);
        }
      }
      vStr->pArray = pcVar5;
      vStr->nCap = (int)sVar9;
    }
LAB_00378768:
    iVar4 = vStr->nSize;
    vStr->nSize = iVar4 + 1;
    vStr->pArray[iVar4] = ' ';
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar9 = 0x10;
    }
    else {
      sVar9 = (ulong)uVar3 * 2;
      if ((int)sVar9 <= (int)uVar3) goto LAB_003787e7;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar9);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar9);
      }
    }
    vStr->pArray = pcVar5;
    vStr->nCap = (int)sVar9;
  }
LAB_003787e7:
  iVar8 = vStr->nSize;
  vStr->nSize = iVar8 + 1;
  vStr->pArray[iVar8] = '\n';
  if (0 < pMan->nGates) {
    lVar6 = 0;
    do {
      if (pMan->pGates[lVar6] == (Super_Gate_t_conflict *)0x0) break;
      puVar1 = &pMan->pGates[lVar6]->field_0x8;
      *puVar1 = *puVar1 | 2;
      lVar6 = lVar6 + 1;
    } while (lVar6 < pMan->nGates);
  }
  local_4c = pMan->nVarsMax;
  if (0 < pMan->nGates) {
    lVar6 = 0;
    do {
      if (pMan->pGates[lVar6] == (Super_Gate_t_conflict *)0x0) break;
      Super_WriteLibraryTreeStr_rec(vStr,pMan,pMan->pGates[lVar6],(int *)&local_4c);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pMan->nGates);
  }
  uVar3 = vStr->nCap;
  if (vStr->nSize == uVar3) {
    if ((int)uVar3 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(0x10);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,0x10);
      }
      sVar9 = 0x10;
    }
    else {
      sVar9 = (ulong)uVar3 * 2;
      if ((int)sVar9 <= (int)uVar3) goto LAB_003788cc;
      if (vStr->pArray == (char *)0x0) {
        pcVar5 = (char *)malloc(sVar9);
      }
      else {
        pcVar5 = (char *)realloc(vStr->pArray,sVar9);
      }
    }
    vStr->pArray = pcVar5;
    vStr->nCap = (int)sVar9;
  }
LAB_003788cc:
  iVar8 = vStr->nSize;
  vStr->nSize = iVar8 + 1;
  vStr->pArray[iVar8] = '\0';
  sprintf(local_48,"%d",(ulong)local_4c);
  sVar9 = strlen(local_48);
  if (0 < (int)(uint)sVar9) {
    uVar7 = 0;
    do {
      if (((int)uVar2 < 0) || (vStr->nSize <= (int)(uVar2 + (int)uVar7))) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x186,"void Vec_StrWriteEntry(Vec_Str_t *, int, char)");
      }
      vStr->pArray[uVar7 + uVar2] = local_48[uVar7];
      uVar7 = uVar7 + 1;
    } while (((uint)sVar9 & 0x7fffffff) != uVar7);
  }
  return vStr;
}

Assistant:

Vec_Str_t * Super_WriteLibraryTreeStr( Super_Man_t * pMan )
{
    char pInsert[16];
    Vec_Str_t * vStr;
    Super_Gate_t * pSuper;
    int i, Counter;
    int posStart;
     // write the elementary variables
    vStr = Vec_StrAlloc( 1000 );
    Super_WriteFileHeaderStr( pMan, vStr );
    // write the place holder for the number of lines
    posStart = Vec_StrSize( vStr );
    for ( i = 0; i < 9; i++ )
        Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '\n' );
    // mark the real supergates
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        pSuper->fSuper = 1;
    // write the supergates
    Counter = pMan->nVarsMax;
    Super_ManForEachGate( pMan->pGates, pMan->nGates, i, pSuper )
        Super_WriteLibraryTreeStr_rec( vStr, pMan, pSuper, &Counter );
    Vec_StrPush( vStr, 0 );
    // write the number of lines
    sprintf( pInsert, "%d", Counter );
    for ( i = 0; i < (int)strlen(pInsert); i++ )
        Vec_StrWriteEntry( vStr, posStart + i, pInsert[i] );
    return vStr;
}